

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NativeInteger.c
# Opt level: O2

asn_dec_rval_t
NativeInteger_decode_uper
          (asn_codec_ctx_t *opt_codec_ctx,asn_TYPE_descriptor_t *td,
          asn_per_constraints_t *constraints,void **sptr,asn_per_data_t *pd)

{
  void *pvVar1;
  INTEGER_t *pIVar2;
  int iVar3;
  unsigned_long *lptr;
  asn_dec_rval_t aVar5;
  ulong uStack_60;
  INTEGER_t tmpint;
  void *tmpintptr;
  size_t sVar4;
  
  tmpintptr = &tmpint;
  pvVar1 = td->specifics;
  lptr = (unsigned_long *)*sptr;
  pIVar2 = &tmpint;
  if (lptr == (unsigned_long *)0x0) {
    lptr = (unsigned_long *)calloc(1,8);
    *sptr = lptr;
    pIVar2 = (INTEGER_t *)tmpintptr;
    if (lptr == (unsigned_long *)0x0) {
      uStack_60 = 2;
      sVar4 = 0;
      goto LAB_001413c4;
    }
  }
  tmpintptr = pIVar2;
  tmpint.buf = (uint8_t *)0x0;
  tmpint.size = 0;
  tmpint._12_4_ = 0;
  aVar5 = INTEGER_decode_uper(opt_codec_ctx,td,constraints,&tmpintptr,pd);
  sVar4 = aVar5.consumed;
  uStack_60 = (ulong)aVar5.code;
  if (aVar5.code == RC_OK) {
    uStack_60 = 2;
    if ((pvVar1 == (void *)0x0) || (*(int *)((long)pvVar1 + 0x20) == 0)) {
      iVar3 = asn_INTEGER2long(&tmpint,(long *)lptr);
    }
    else {
      iVar3 = asn_INTEGER2ulong(&tmpint,lptr);
    }
    if (iVar3 == 0) {
      uStack_60 = 0;
    }
  }
  (*asn_DEF_INTEGER.free_struct)(&asn_DEF_INTEGER,&tmpint,1);
LAB_001413c4:
  aVar5.consumed = sVar4;
  aVar5._0_8_ = uStack_60;
  return aVar5;
}

Assistant:

asn_dec_rval_t
NativeInteger_decode_uper(asn_codec_ctx_t *opt_codec_ctx,
	asn_TYPE_descriptor_t *td,
	asn_per_constraints_t *constraints, void **sptr, asn_per_data_t *pd) {

	asn_INTEGER_specifics_t *specs=(asn_INTEGER_specifics_t *)td->specifics;
	asn_dec_rval_t rval;
	long *native = (long *)*sptr;
	INTEGER_t tmpint;
	void *tmpintptr = &tmpint;

	(void)opt_codec_ctx;
	ASN_DEBUG("Decoding NativeInteger %s (UPER)", td->name);

	if(!native) {
		native = (long *)(*sptr = CALLOC(1, sizeof(*native)));
		if(!native) ASN__DECODE_FAILED;
	}

	memset(&tmpint, 0, sizeof tmpint);
	rval = INTEGER_decode_uper(opt_codec_ctx, td, constraints,
				   &tmpintptr, pd);
	if(rval.code == RC_OK) {
		if((specs&&specs->field_unsigned)
			? asn_INTEGER2ulong(&tmpint, (unsigned long *)native)
			: asn_INTEGER2long(&tmpint, native))
			rval.code = RC_FAIL;
		else
			ASN_DEBUG("NativeInteger %s got value %ld",
				td->name, *native);
	}
	ASN_STRUCT_FREE_CONTENTS_ONLY(asn_DEF_INTEGER, &tmpint);

	return rval;
}